

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_type *psVar1;
  pointer *pppBVar2;
  pointer ppBVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  ostream *poVar8;
  mapped_type *pmVar9;
  long *plVar10;
  undefined8 *puVar11;
  ulong *puVar12;
  int i;
  int _logN;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  counter;
  PathOram oram;
  allocator local_14c9;
  ulong *local_14c8;
  long local_14c0;
  ulong local_14b8;
  long lStack_14b0;
  long local_14a8;
  char **local_14a0;
  string local_1498;
  ulong *local_1478;
  long local_1470;
  ulong local_1468 [2];
  undefined1 *local_1458 [2];
  undefined1 local_1448 [16];
  map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  local_1438;
  TreeOram local_1408;
  
  local_14a0 = argv;
  std::__cxx11::string::string((string *)&local_1408,argv[1],(allocator *)&local_14c8);
  ppBVar3 = local_1408.tree.super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  piVar6 = __errno_location();
  iVar5 = *piVar6;
  *piVar6 = 0;
  lVar7 = strtol((char *)ppBVar3,(char **)&local_1438,10);
  if ((pointer)local_1438._M_t._M_impl._0_8_ == ppBVar3) {
    lVar7 = std::__throw_invalid_argument("stoi");
  }
  iVar4 = *piVar6;
  _logN = (int)lVar7;
  if (_logN != lVar7 || iVar4 == 0x22) {
    iVar4 = std::__throw_out_of_range("stoi");
  }
  if (iVar4 == 0) {
    *piVar6 = iVar5;
  }
  pppBVar2 = &local_1408.tree.super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (local_1408.tree.super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppBVar2) {
    operator_delete(local_1408.tree.
                    super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__cxx11::string::string((string *)&local_1408,local_14a0[2],(allocator *)&local_14c8);
  ppBVar3 = local_1408.tree.super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  iVar5 = *piVar6;
  *piVar6 = 0;
  local_14a8 = strtol((char *)local_1408.tree.
                              super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,(char **)&local_1438,10);
  if ((pointer)local_1438._M_t._M_impl._0_8_ == ppBVar3) {
    local_14a8 = std::__throw_invalid_argument("stoi");
  }
  iVar4 = *piVar6;
  if (local_14a8 - 0x80000000U < 0xffffffff00000000 || iVar4 == 0x22) {
    iVar4 = 0x1060e4;
    local_14a8 = std::__throw_out_of_range("stoi");
  }
  if (iVar4 == 0) {
    *piVar6 = iVar5;
  }
  if (local_1408.tree.super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppBVar2) {
    operator_delete(local_1408.tree.
                    super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  TreeOram::TreeOram(&local_1408,_logN,(int)local_14a8,_logN);
  local_1438._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_1438 + 8);
  local_1438._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1438._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1438._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1438._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1438._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Starting warmming up with ",0x1a);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x100000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," operations.",0xc);
  std::endl<char,std::char_traits<char>>(poVar8);
  lVar14 = (long)(1 << ((byte)lVar7 & 0x1f));
  lVar7 = 0x100000;
  if (0x100000 < lVar14) {
    lVar7 = lVar14;
  }
  lVar13 = 0;
  do {
    PathOram::access((PathOram *)&local_1408,(char *)(lVar13 % lVar14 & 0xffffffff),
                     (int)(lVar13 % lVar14));
    lVar13 = lVar13 + 1;
  } while (lVar7 != lVar13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Warmup completed.",0x11)
  ;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  uVar16 = 1;
  lVar7 = 0;
  do {
    iVar5 = PathOram::access((PathOram *)&local_1408,(char *)(lVar7 % lVar14 & 0xffffffff),
                             (int)(lVar7 % lVar14));
    if ((char)iVar5 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tree oram invariance is broken",0x1e);
      poVar8 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    if ((ulong *)(long)(local_1408.stash)->bsize == (ulong *)0x32) {
      exit(1);
    }
    local_14c8 = (ulong *)(long)(local_1408.stash)->bsize;
    pmVar9 = std::
             map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
             ::operator[](&local_1438,(key_type *)&local_14c8);
    *pmVar9 = *pmVar9 + 1;
    if ((uVar16 / 1000000) * 1000000 + -1 == lVar7) {
      local_1458[0] = local_1448;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1458,"path","");
      plVar10 = (long *)std::__cxx11::string::append((char *)local_1458);
      puVar12 = (ulong *)(plVar10 + 2);
      if ((ulong *)*plVar10 == puVar12) {
        local_14b8 = *puVar12;
        lStack_14b0 = plVar10[3];
        local_14c8 = &local_14b8;
      }
      else {
        local_14b8 = *puVar12;
        local_14c8 = (ulong *)*plVar10;
      }
      local_14c0 = plVar10[1];
      *plVar10 = (long)puVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::string((string *)&local_1478,local_14a0[1],&local_14c9);
      uVar15 = 0xf;
      if (local_14c8 != &local_14b8) {
        uVar15 = local_14b8;
      }
      if (uVar15 < (ulong)(local_1470 + local_14c0)) {
        uVar15 = 0xf;
        if (local_1478 != local_1468) {
          uVar15 = local_1468[0];
        }
        if (uVar15 < (ulong)(local_1470 + local_14c0)) goto LAB_00103c8e;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_1478,0,(char *)0x0,(ulong)local_14c8);
      }
      else {
LAB_00103c8e:
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&local_14c8,(ulong)local_1478);
      }
      psVar1 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_1498.field_2._M_allocated_capacity = *psVar1;
        local_1498.field_2._8_8_ = puVar11[3];
        local_1498._M_dataplus._M_p = (pointer)&local_1498.field_2;
      }
      else {
        local_1498.field_2._M_allocated_capacity = *psVar1;
        local_1498._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_1498._M_string_length = puVar11[1];
      *puVar11 = psVar1;
      puVar11[1] = 0;
      *(undefined1 *)psVar1 = 0;
      pruint64_t(lVar7 + 1,&local_1438,&local_1498,(int)local_14a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1498._M_dataplus._M_p != &local_1498.field_2) {
        operator_delete(local_1498._M_dataplus._M_p);
      }
      if (local_1478 != local_1468) {
        operator_delete(local_1478);
      }
      if (local_14c8 != &local_14b8) {
        operator_delete(local_14c8);
      }
      if (local_1458[0] != local_1448) {
        operator_delete(local_1458[0]);
      }
    }
    uVar16 = uVar16 + 1;
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

int main(int argc, char ** argv )
{
   int logN = stoi(string(argv[1]));
   int cap = stoi(string(argv[2]));
   long long N = (1<<logN);
   PathOram oram(logN, cap);
   long long i = 0;
   int warmup = 1<<20;
   map<long long, long long> counter;
   
   cout <<"Starting warmming up with "<<warmup<<" operations."<<endl;
   for(int i = 0; i < (N > warmup ? N : warmup); ++i)
      oram.access(i%N);
   i = 0;
   cout <<"Warmup completed."<<endl;
   while(true)
   {
      bool res = oram.access(i%N);
      if(not res)
      {
         cout<<"tree oram invariance is broken"<<i<<endl;
      }
      ++counter[oram.stash_size()];
      ++i;
      if((i%1000000) == 0)
         pruint64_t(i, counter, string("path")+"_"+string(argv[1]), cap);
   }
}